

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void reset_source(vw *all,size_t numbits)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  char **ppcVar4;
  ostream *poVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  int *piVar10;
  char *pcVar11;
  string *psVar12;
  ulong in_RSI;
  long in_RDI;
  stringstream __msg_2;
  int in_stack_00000174;
  io_buf *in_stack_00000178;
  size_t i;
  stringstream __msg_1;
  int f;
  socklen_t size;
  sockaddr_in client_address;
  unique_lock<std::mutex> lock;
  v_array<int> *fps;
  int fd;
  stringstream __msg;
  io_buf *input;
  v_array<char> *in_stack_fffffffffffffa08;
  v_array<int> *in_stack_fffffffffffffa10;
  io_buf *in_stack_fffffffffffffa18;
  long *plVar13;
  anon_class_8_1_ba1d3501 in_stack_fffffffffffffa20;
  string *in_stack_fffffffffffffa28;
  string *pmessage;
  int *in_stack_fffffffffffffa30;
  char *in_stack_fffffffffffffa38;
  vw_exception *in_stack_fffffffffffffa40;
  vw_exception *this;
  stringstream local_550 [16];
  ostream local_540;
  string *local_3c8;
  int local_3c0;
  undefined1 local_3b9;
  stringstream local_398 [16];
  ostream local_388;
  int local_210;
  socklen_t local_20c;
  sockaddr local_208;
  long local_1f8;
  undefined1 local_1f0 [24];
  int local_1d8;
  undefined1 local_1d1;
  stringstream local_1a0 [16];
  ostream local_190;
  long *local_18;
  ulong local_10;
  long local_8;
  
  local_18 = *(long **)(*(long *)(in_RDI + 8) + 0x1e8);
  local_18[0xb] = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x218) & 1) != 0) {
    (**(code **)(**(long **)(*(long *)(in_RDI + 8) + 0x210) + 0x38))();
    *(undefined1 *)(*(long *)(local_8 + 8) + 0x218) = 0;
    (**(code **)(**(long **)(*(long *)(local_8 + 8) + 0x210) + 0x40))();
    ppcVar4 = v_array<char>::begin
                        ((v_array<char> *)(*(long *)(*(long *)(local_8 + 8) + 0x210) + 0x88));
    remove(*ppcVar4);
    ppcVar4 = v_array<char>::begin
                        ((v_array<char> *)(*(long *)(*(long *)(local_8 + 8) + 0x210) + 0x68));
    pcVar11 = *ppcVar4;
    ppcVar4 = v_array<char>::begin
                        ((v_array<char> *)(*(long *)(*(long *)(local_8 + 8) + 0x210) + 0x88));
    iVar2 = rename(pcVar11,*ppcVar4);
    if (iVar2 != 0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      iVar2 = (int)((ulong)in_stack_fffffffffffffa30 >> 0x20);
      std::operator<<(&local_190,"WARN: reset_source(vw& all, size_t numbits) cannot rename: ");
      poVar5 = operator<<((ostream *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
      std::operator<<(poVar5," to ");
      operator<<((ostream *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08);
      local_1d1 = 1;
      uVar6 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,iVar2,in_stack_fffffffffffffa28
                );
      local_1d1 = 0;
      __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    while (lVar7 = (**(code **)(*local_18 + 0x20))(), plVar13 = local_18, lVar7 != 0) {
      uVar8 = (**(code **)(*local_18 + 0x48))();
      if ((uVar8 & 1) == 0) {
        local_1d8 = v_array<int>::pop((v_array<int> *)(local_18 + 6));
        local_1f0._16_8_ = local_8 + 0x3510;
        v_array<int>::cbegin((v_array<int> *)local_1f0._16_8_);
        v_array<int>::cend((v_array<int> *)local_1f0._16_8_);
        piVar9 = std::find<int*,int>(in_stack_fffffffffffffa30,(int *)in_stack_fffffffffffffa28,
                                     (int *)in_stack_fffffffffffffa20.all);
        piVar10 = v_array<int>::cend((v_array<int> *)local_1f0._16_8_);
        if (piVar9 == piVar10) {
          io_buf::close_file_or_socket(0);
        }
      }
      else {
        (**(code **)(*local_18 + 0x40))();
      }
    }
    ppcVar4 = v_array<char>::begin
                        ((v_array<char> *)(*(long *)(*(long *)(local_8 + 8) + 0x210) + 0x88));
    (**(code **)*plVar13)(plVar13,*ppcVar4,*(byte *)(local_8 + 0x3558) & 1,1);
    *(code **)(*(long *)(local_8 + 8) + 0x1f0) = read_cached_features;
  }
  if ((*(byte *)(*(long *)(local_8 + 8) + 0x208) & 1) == 1) {
    if ((*(byte *)(local_8 + 0x80) & 1) == 0) {
      local_3c8 = (string *)0x0;
      while (pmessage = local_3c8,
            psVar12 = (string *)v_array<int>::size((v_array<int> *)(local_18 + 6)),
            pmessage < psVar12) {
        plVar13 = local_18;
        piVar9 = v_array<int>::operator[]((v_array<int> *)(local_18 + 6),(size_t)local_3c8);
        (**(code **)(*plVar13 + 8))(plVar13,*piVar9);
        v_array<int>::operator[]((v_array<int> *)(local_18 + 6),(size_t)local_3c8);
        uVar3 = cache_numbits(in_stack_00000178,in_stack_00000174);
        iVar2 = (int)((ulong)in_stack_fffffffffffffa30 >> 0x20);
        if (uVar3 < local_10) {
          std::__cxx11::stringstream::stringstream(local_550);
          std::operator<<(&local_540,"argh, a bug in caching of some sort!");
          uVar6 = __cxa_allocate_exception(0x38);
          std::__cxx11::stringstream::str();
          VW::vw_exception::vw_exception
                    (in_stack_fffffffffffffa40,in_stack_fffffffffffffa38,iVar2,pmessage);
          __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        local_3c8 = (string *)&local_3c8->field_0x1;
      }
    }
    else {
      this = (vw_exception *)local_1f0;
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)in_stack_fffffffffffffa10,
                 (mutex_type *)in_stack_fffffffffffffa08);
      local_1f8 = local_8;
      std::condition_variable::wait<reset_source(vw&,unsigned_long)::__0>
                ((condition_variable *)in_stack_fffffffffffffa18,
                 (unique_lock<std::mutex> *)in_stack_fffffffffffffa10,in_stack_fffffffffffffa20);
      std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)in_stack_fffffffffffffa10);
      v_array<int>::operator[]((v_array<int> *)(*(long *)(*(long *)(local_8 + 8) + 0x1e8) + 0x30),0)
      ;
      io_buf::close_file_or_socket(0);
      v_array<int>::clear(in_stack_fffffffffffffa10);
      v_array<int>::clear(in_stack_fffffffffffffa10);
      local_20c = 0x10;
      local_3c0 = accept(*(int *)(*(long *)(local_8 + 8) + 0x30c),&local_208,&local_20c);
      local_210 = local_3c0;
      if (local_3c0 < 0) {
        std::__cxx11::stringstream::stringstream(local_398);
        poVar5 = std::operator<<(&local_388,"accept: ");
        piVar9 = __errno_location();
        pcVar11 = strerror(*piVar9);
        std::operator<<(poVar5,pcVar11);
        local_3b9 = 1;
        uVar6 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (this,(char *)poVar5,(int)((ulong)uVar6 >> 0x20),in_stack_fffffffffffffa28);
        local_3b9 = 0;
        __cxa_throw(uVar6,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      v_array<int>::push_back(in_stack_fffffffffffffa10,(int *)in_stack_fffffffffffffa08);
      v_array<int>::push_back(in_stack_fffffffffffffa10,(int *)in_stack_fffffffffffffa08);
      bVar1 = isbinary(in_stack_fffffffffffffa18);
      if (bVar1) {
        *(code **)(*(long *)(local_8 + 8) + 0x1f0) = read_cached_features;
        *(code **)(local_8 + 0x3538) = binary_print_result;
      }
      else {
        *(code **)(*(long *)(local_8 + 8) + 0x1f0) = read_features_string;
        *(code **)(local_8 + 0x3538) = print_result;
      }
    }
  }
  return;
}

Assistant:

void reset_source(vw& all, size_t numbits)
{
  io_buf* input = all.p->input;
  input->current = 0;
  if (all.p->write_cache)
  {
    all.p->output->flush();
    all.p->write_cache = false;
    all.p->output->close_file();
    remove(all.p->output->finalname.begin());

    if (0 != rename(all.p->output->currentname.begin(), all.p->output->finalname.begin()))
      THROW("WARN: reset_source(vw& all, size_t numbits) cannot rename: " << all.p->output->currentname << " to "
                                                                          << all.p->output->finalname);

    while (input->num_files() > 0)
      if (input->compressed())
        input->close_file();
      else
      {
        int fd = input->files.pop();
        const auto& fps = all.final_prediction_sink;

        // If the current popped file is not in the list of final predictions sinks, close it.
        if(std::find(fps.cbegin(), fps.cend(), fd) == fps.cend())
          io_buf::close_file_or_socket(fd);
      }
    input->open_file(all.p->output->finalname.begin(), all.stdin_off, io_buf::READ);  // pushing is merged into
                                                                                      // open_file
    all.p->reader = read_cached_features;
  }
  if (all.p->resettable == true)
  {
    if (all.daemon)
    {
      // wait for all predictions to be sent back to client
      {
        std::unique_lock<std::mutex> lock(all.p->output_lock);
        all.p->output_done.wait(lock, [&] { return all.p->ready_parsed_examples.size() == 0; });
      }

      // close socket, erase final prediction sink and socket
      io_buf::close_file_or_socket(all.p->input->files[0]);
      all.final_prediction_sink.clear();
      all.p->input->files.clear();

      sockaddr_in client_address;
      socklen_t size = sizeof(client_address);
      int f = (int)accept(all.p->bound_sock, (sockaddr*)&client_address, &size);
      if (f < 0)
        THROW("accept: " << strerror(errno));

      // note: breaking cluster parallel online learning by dropping support for id

      all.final_prediction_sink.push_back((size_t)f);
      all.p->input->files.push_back(f);

      if (isbinary(*(all.p->input)))
      {
        all.p->reader = read_cached_features;
        all.print = binary_print_result;
      }
      else
      {
        all.p->reader = read_features_string;
        all.print = print_result;
      }
    }
    else
    {
      for (size_t i = 0; i < input->files.size(); i++)
      {
        input->reset_file(input->files[i]);
        if (cache_numbits(input, input->files[i]) < numbits)
          THROW("argh, a bug in caching of some sort!");
      }
    }
  }
}